

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1656a7::GenerationIterator::add_transaction(GenerationIterator *this)

{
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_70;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> local_58;
  
  pstore::begin(&local_58,&this->db_);
  pstore::transaction_base::alloc_rw<int,void>(&local_70,&local_58.super_transaction_base,1);
  *local_70.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x25;
  if (local_70.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  pstore::transaction_base::commit(&local_58.super_transaction_base);
  local_58.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00272628;
  pstore::transaction_base::rollback(&local_58.super_transaction_base);
  pstore::lock_guard<pstore::transaction_mutex>::~lock_guard(&local_58.lock_);
  return;
}

Assistant:

void add_transaction () {
            auto transaction = pstore::begin (db_);
            *(transaction.alloc_rw<int> ().first) = 37;
            transaction.commit ();
        }